

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O3

MATRIX mat_backsubs1(MATRIX A,MATRIX B,MATRIX X,MATRIX P,int xcol)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  MATRIX ppdVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  
  iVar1 = *(int *)((long)A + -4);
  uVar4 = (ulong)iVar1;
  if (0 < (long)uVar4) {
    uVar8 = uVar4;
    ppdVar10 = P;
    uVar9 = 0;
    do {
      uVar11 = uVar9 + 1;
      if (uVar11 < uVar4) {
        pdVar2 = P[uVar9];
        uVar12 = 1;
        do {
          *B[(int)*ppdVar10[uVar12]] =
               *B[(int)*ppdVar10[uVar12]] - A[(int)*ppdVar10[uVar12]][uVar9] * *B[(int)*pdVar2];
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
      }
      ppdVar10 = ppdVar10 + 1;
      uVar8 = uVar8 - 1;
      uVar9 = uVar11;
    } while (uVar11 != uVar4);
  }
  uVar7 = iVar1 - 1;
  X[(int)uVar7][xcol] = *B[(int)*P[(int)uVar7]] / A[(int)*P[(int)uVar7]][(int)uVar7];
  if (1 < iVar1) {
    uVar9 = (ulong)uVar7;
    lVar5 = uVar9 * 8;
    ppdVar10 = X + uVar9;
    uVar8 = (ulong)(iVar1 - 2);
    do {
      dVar13 = 0.0;
      if ((long)uVar8 < (long)(uVar4 - 1)) {
        lVar6 = 0;
        do {
          dVar13 = dVar13 + *(double *)((long)A[(int)*P[uVar8]] + lVar6 * 8 + lVar5) *
                            ppdVar10[lVar6][xcol];
          lVar6 = lVar6 + 1;
        } while ((int)uVar9 + (int)lVar6 < iVar1);
      }
      X[uVar8][xcol] = (*B[(int)*P[uVar8]] - dVar13) / A[(int)*P[uVar8]][uVar8];
      uVar9 = uVar9 - 1;
      ppdVar10 = ppdVar10 + -1;
      lVar5 = lVar5 + -8;
      bVar3 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
  }
  return X;
}

Assistant:

MATRIX mat_backsubs1( MATRIX A, MATRIX B, MATRIX X, MATRIX P, int xcol )
{
	int	i, j, k, n;
	double	sum;

	n = MatCol(A);

	for (k=0; k<n; k++)
		{
		for (i=k+1; i<n; i++)
			B[(int)P[i][0]][0] -= A[(int)P[i][0]][k] * B[(int)P[k][0]][0];
		}

	X[n-1][xcol] = B[(int)P[n-1][0]][0] / A[(int)P[n-1][0]][n-1];
	for (k=n-2; k>=0; k--)
		{
		sum = 0.0;
		for (j=k+1; j<n; j++)
			{
			sum += A[(int)P[k][0]][j] * X[j][xcol];
			}
		X[k][xcol] = (B[(int)P[k][0]][0] - sum) / A[(int)P[k][0]][k];
		}

	return (X);
}